

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetupColumn
               (char *label,ImGuiTableColumnFlags flags,float init_width_or_weight,ImGuiID user_id)

{
  char cVar1;
  int iVar2;
  ImGuiTable *table;
  short sVar3;
  uint uVar4;
  size_t sVar5;
  ImGuiTableColumn *column;
  
  table = GImGui->CurrentTable;
  cVar1 = table->DeclColumnsCount;
  if ((int)cVar1 < table->ColumnsCount) {
    column = (table->Columns).Data + (int)cVar1;
    table->DeclColumnsCount = cVar1 + '\x01';
    if ((((flags & 0x18U) == 0) && (0.0 < init_width_or_weight)) &&
       ((uVar4 = table->Flags & 0xe000, uVar4 == 0x4000 || (uVar4 == 0x2000)))) {
      flags = flags | 0x10;
    }
    TableSetupColumnFlags(table,column,flags);
    column->UserID = user_id;
    uVar4 = column->Flags;
    column->InitStretchWeightOrWidth = init_width_or_weight;
    if (table->IsInitializing == true) {
      if ((column->WidthRequest <= 0.0 && column->WidthRequest != 0.0) &&
         (column->StretchWeight <= 0.0 && column->StretchWeight != 0.0)) {
        if ((0.0 < init_width_or_weight) && ((uVar4 & 0x10) != 0)) {
          column->WidthRequest = init_width_or_weight;
        }
        if ((uVar4 & 8) != 0) {
          column->StretchWeight =
               (float)(~-(uint)(0.0 < init_width_or_weight) & 0xbf800000 |
                      -(uint)(0.0 < init_width_or_weight) & (uint)init_width_or_weight);
        }
        if (0.0 < init_width_or_weight) {
          column->AutoFitQueue = '\0';
        }
      }
      if (((uVar4 & 2) != 0) && ((table->SettingsLoadedFlags & 4) == 0)) {
        column->IsUserEnabled = false;
        column->IsUserEnabledNextFrame = false;
      }
      if (((uVar4 & 4) != 0) && ((table->SettingsLoadedFlags & 8) == 0)) {
        column->SortOrder = '\0';
        column->field_0x65 = ((column->field_0x65 & 0xfc) - (-1 < (short)column->Flags)) + '\x02';
      }
    }
    column->NameOffset = -1;
    if ((label != (char *)0x0) && (*label != '\0')) {
      iVar2 = (table->ColumnsNames).Buf.Size;
      sVar3 = (short)iVar2 + -1;
      if (iVar2 == 0) {
        sVar3 = 0;
      }
      column->NameOffset = sVar3;
      sVar5 = strlen(label);
      ImGuiTextBuffer::append(&table->ColumnsNames,label,label + sVar5 + 1);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetupColumn(const char* label, ImGuiTableColumnFlags flags, float init_width_or_weight, ImGuiID user_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call call TableSetupColumn() before first row!");
    IM_ASSERT((flags & ImGuiTableColumnFlags_StatusMask_) == 0 && "Illegal to pass StatusMask values to TableSetupColumn()");
    if (table->DeclColumnsCount >= table->ColumnsCount)
    {
        IM_ASSERT_USER_ERROR(table->DeclColumnsCount < table->ColumnsCount, "Called TableSetupColumn() too many times!");
        return;
    }

    ImGuiTableColumn* column = &table->Columns[table->DeclColumnsCount];
    table->DeclColumnsCount++;

    // Assert when passing a width or weight if policy is entirely left to default, to avoid storing width into weight and vice-versa.
    // Give a grace to users of ImGuiTableFlags_ScrollX.
    if (table->IsDefaultSizingPolicy && (flags & ImGuiTableColumnFlags_WidthMask_) == 0 && (flags & ImGuiTableFlags_ScrollX) == 0)
        IM_ASSERT(init_width_or_weight <= 0.0f && "Can only specify width/weight if sizing policy is set explicitly in either Table or Column.");

    // When passing a width automatically enforce WidthFixed policy
    // (whereas TableSetupColumnFlags would default to WidthAuto if table is not Resizable)
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0 && init_width_or_weight > 0.0f)
        if ((table->Flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedFit || (table->Flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;

    TableSetupColumnFlags(table, column, flags);
    column->UserID = user_id;
    flags = column->Flags;

    // Initialize defaults
    column->InitStretchWeightOrWidth = init_width_or_weight;
    if (table->IsInitializing)
    {
        // Init width or weight
        if (column->WidthRequest < 0.0f && column->StretchWeight < 0.0f)
        {
            if ((flags & ImGuiTableColumnFlags_WidthFixed) && init_width_or_weight > 0.0f)
                column->WidthRequest = init_width_or_weight;
            if (flags & ImGuiTableColumnFlags_WidthStretch)
                column->StretchWeight = (init_width_or_weight > 0.0f) ? init_width_or_weight : -1.0f;

            // Disable auto-fit if an explicit width/weight has been specified
            if (init_width_or_weight > 0.0f)
                column->AutoFitQueue = 0x00;
        }

        // Init default visibility/sort state
        if ((flags & ImGuiTableColumnFlags_DefaultHide) && (table->SettingsLoadedFlags & ImGuiTableFlags_Hideable) == 0)
            column->IsUserEnabled = column->IsUserEnabledNextFrame = false;
        if (flags & ImGuiTableColumnFlags_DefaultSort && (table->SettingsLoadedFlags & ImGuiTableFlags_Sortable) == 0)
        {
            column->SortOrder = 0; // Multiple columns using _DefaultSort will be reassigned unique SortOrder values when building the sort specs.
            column->SortDirection = (column->Flags & ImGuiTableColumnFlags_PreferSortDescending) ? (ImS8)ImGuiSortDirection_Descending : (ImU8)(ImGuiSortDirection_Ascending);
        }
    }

    // Store name (append with zero-terminator in contiguous buffer)
    column->NameOffset = -1;
    if (label != NULL && label[0] != 0)
    {
        column->NameOffset = (ImS16)table->ColumnsNames.size();
        table->ColumnsNames.append(label, label + strlen(label) + 1);
    }
}